

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  FieldValuePrinter *this_00;
  undefined7 in_register_00000031;
  
  this_00 = (FieldValuePrinter *)operator_new(8);
  if ((int)CONCAT71(in_register_00000031,as_utf8) == 0) {
    FieldValuePrinter::FieldValuePrinter(this_00);
  }
  else {
    this_00->_vptr_FieldValuePrinter = (_func_int **)&PTR__FieldValuePrinter_0042ea00;
  }
  internal::scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter>::reset
            (&this->default_field_value_printer_,this_00);
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8
                              ? new FieldValuePrinterUtf8Escaping()
                              : new FieldValuePrinter());
}